

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::emit_hoisted_temporaries
          (CompilerGLSL *this,
          SmallVector<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>,_8UL>
          *temporaries)

{
  uint id;
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>
  *ppVar4;
  pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>
  *ppVar5;
  SPIRType *type_00;
  pointer ppVar6;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> pVar7;
  bool local_231;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230 [32];
  string local_210 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0 [32];
  undefined1 local_1d0 [36];
  ID local_1ac;
  Bitset *local_1a8;
  Bitset *mirror_flags;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> _Stack_198;
  uint32_t mirror_id;
  uint32_t local_18c;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_188;
  iterator mirrored_precision_itr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178 [32];
  _Node_iterator_base<unsigned_int,_false> local_158;
  char local_150;
  uint32_t local_144;
  _Node_iterator_base<unsigned_int,_false> local_140;
  char local_138;
  uint32_t local_12c;
  string local_128 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108 [32];
  undefined1 local_e8 [64];
  spirv_cross local_a8 [48];
  string local_78 [8];
  string initializer;
  Bitset *flags;
  SPIRType *type;
  pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>
  *tmp;
  pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>
  *__end1;
  pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>
  *__begin1;
  SmallVector<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>,_8UL>
  *__range1;
  SmallVector<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>,_8UL>
  *temporaries_local;
  CompilerGLSL *this_local;
  
  ppVar4 = ::std::
           begin<spirv_cross::SmallVector<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,spirv_cross::TypedID<(spirv_cross::Types)0>>,8ul>>
                     (temporaries);
  ppVar5 = ::std::
           end<spirv_cross::SmallVector<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,spirv_cross::TypedID<(spirv_cross::Types)0>>,8ul>>
                     (temporaries);
  ::std::
  sort<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,spirv_cross::TypedID<(spirv_cross::Types)0>>*,spirv_cross::CompilerGLSL::emit_hoisted_temporaries(spirv_cross::SmallVector<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,spirv_cross::TypedID<(spirv_cross::Types)0>>,8ul>&)::__0>
            (ppVar4,ppVar5);
  __end1 = VectorView<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>
           ::begin(&temporaries->
                    super_VectorView<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>
                  );
  ppVar4 = VectorView<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>
           ::end(&temporaries->
                  super_VectorView<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>
                );
  for (; __end1 != ppVar4; __end1 = __end1 + 1) {
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)__end1);
    type_00 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,uVar2);
    if (((type_00->pointer & 1U) == 0) || (((this->backend).native_pointers & 1U) != 0)) {
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&__end1->second);
      add_local_variable_name(this,uVar2);
      Compiler::get_decoration_bitset(&this->super_Compiler,(ID)(__end1->second).id);
      ::std::__cxx11::string::string(local_78);
      if ((((this->options).force_zero_initialized_variables & 1U) != 0) &&
         (bVar1 = type_can_zero_initialize(this,type_00), bVar1)) {
        uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)__end1);
        (*(this->super_Compiler)._vptr_Compiler[0x37])(local_e8 + 0x20,this,(ulong)uVar2);
        join<char_const(&)[4],std::__cxx11::string>
                  (local_a8,(char (*) [4])0x5cb349,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_e8 + 0x20));
        ::std::__cxx11::string::operator=(local_78,(string *)local_a8);
        ::std::__cxx11::string::~string((string *)local_a8);
        ::std::__cxx11::string::~string((string *)(local_e8 + 0x20));
      }
      flags_to_qualifiers_glsl_abi_cxx11_
                ((CompilerGLSL *)local_e8,(SPIRType *)this,(Bitset *)type_00);
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&__end1->second);
      (*(this->super_Compiler)._vptr_Compiler[6])(local_128,this,(ulong)uVar2,1);
      (*(this->super_Compiler)._vptr_Compiler[0x1b])(local_108,this,type_00,local_128,0);
      statement<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string&,char_const(&)[2]>
                (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8,
                 local_108,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                 (char (*) [2])0x5b3b6f);
      ::std::__cxx11::string::~string((string *)local_108);
      ::std::__cxx11::string::~string(local_128);
      ::std::__cxx11::string::~string((string *)local_e8);
      local_12c = TypedID::operator_cast_to_unsigned_int((TypedID *)&__end1->second);
      pVar7 = ::std::
              unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              ::insert(&(this->super_Compiler).hoisted_temporaries,&local_12c);
      local_140._M_cur =
           (__node_type *)pVar7.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
      local_138 = pVar7.second;
      local_144 = TypedID::operator_cast_to_unsigned_int((TypedID *)&__end1->second);
      pVar7 = ::std::
              unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              ::insert(&(this->super_Compiler).forced_temporaries,&local_144);
      local_158._M_cur =
           (__node_type *)pVar7.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
      local_150 = pVar7.second;
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&__end1->second);
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&__end1->second);
      (*(this->super_Compiler)._vptr_Compiler[6])(local_178,this,(ulong)uVar3,1);
      mirrored_precision_itr.
      super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur._7_1_ = 1
      ;
      Compiler::
      set<spirv_cross::SPIRExpression,std::__cxx11::string,spirv_cross::TypedID<(spirv_cross::Types)1>&,bool>
                (&this->super_Compiler,uVar2,local_178,&__end1->first,
                 (bool *)((long)&mirrored_precision_itr.
                                 super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                                 ._M_cur + 7));
      ::std::__cxx11::string::~string((string *)local_178);
      local_18c = TypedID::operator_cast_to_unsigned_int((TypedID *)&__end1->second);
      local_188._M_cur =
           (__node_type *)
           ::std::
           unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
           ::find(&this->temporary_to_mirror_precision_alias,&local_18c);
      _Stack_198._M_cur =
           (__node_type *)
           ::std::
           unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
           ::end(&this->temporary_to_mirror_precision_alias);
      bVar1 = ::std::__detail::operator!=(&local_188,&stack0xfffffffffffffe68);
      if (bVar1) {
        ppVar6 = ::std::__detail::
                 _Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>::
                 operator->((_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>
                             *)&local_188);
        mirror_flags._4_4_ = ppVar6->second;
        TypedID<(spirv_cross::Types)0>::TypedID(&local_1ac,mirror_flags._4_4_);
        local_1a8 = Compiler::get_decoration_bitset(&this->super_Compiler,local_1ac);
        flags_to_qualifiers_glsl_abi_cxx11_
                  ((CompilerGLSL *)local_1d0,(SPIRType *)this,(Bitset *)type_00);
        (*(this->super_Compiler)._vptr_Compiler[6])(local_210,this,(ulong)mirror_flags._4_4_,1);
        (*(this->super_Compiler)._vptr_Compiler[0x1b])(local_1f0,this,type_00,local_210,0);
        statement<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string&,char_const(&)[2]>
                  (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_1d0,local_1f0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                   (char (*) [2])0x5b3b6f);
        ::std::__cxx11::string::~string((string *)local_1f0);
        ::std::__cxx11::string::~string(local_210);
        ::std::__cxx11::string::~string((string *)local_1d0);
        id = mirror_flags._4_4_;
        (*(this->super_Compiler)._vptr_Compiler[6])(local_230,this,(ulong)mirror_flags._4_4_,1);
        local_231 = true;
        Compiler::
        set<spirv_cross::SPIRExpression,std::__cxx11::string,spirv_cross::TypedID<(spirv_cross::Types)1>&,bool>
                  (&this->super_Compiler,id,local_230,&__end1->first,&local_231);
        ::std::__cxx11::string::~string((string *)local_230);
        ::std::
        unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
        ::insert(&(this->super_Compiler).hoisted_temporaries,(value_type *)((long)&mirror_flags + 4)
                );
      }
      ::std::__cxx11::string::~string(local_78);
    }
  }
  return;
}

Assistant:

void CompilerGLSL::emit_hoisted_temporaries(SmallVector<pair<TypeID, ID>> &temporaries)
{
	// If we need to force temporaries for certain IDs due to continue blocks, do it before starting loop header.
	// Need to sort these to ensure that reference output is stable.
	sort(begin(temporaries), end(temporaries),
	     [](const pair<TypeID, ID> &a, const pair<TypeID, ID> &b) { return a.second < b.second; });

	for (auto &tmp : temporaries)
	{
		auto &type = get<SPIRType>(tmp.first);

		// There are some rare scenarios where we are asked to declare pointer types as hoisted temporaries.
		// This should be ignored unless we're doing actual variable pointers and backend supports it.
		// Access chains cannot normally be lowered to temporaries in GLSL and HLSL.
		if (type.pointer && !backend.native_pointers)
			continue;

		add_local_variable_name(tmp.second);
		auto &flags = get_decoration_bitset(tmp.second);

		// Not all targets support pointer literals, so don't bother with that case.
		string initializer;
		if (options.force_zero_initialized_variables && type_can_zero_initialize(type))
			initializer = join(" = ", to_zero_initialized_expression(tmp.first));

		statement(flags_to_qualifiers_glsl(type, flags), variable_decl(type, to_name(tmp.second)), initializer, ";");

		hoisted_temporaries.insert(tmp.second);
		forced_temporaries.insert(tmp.second);

		// The temporary might be read from before it's assigned, set up the expression now.
		set<SPIRExpression>(tmp.second, to_name(tmp.second), tmp.first, true);

		// If we have hoisted temporaries in multi-precision contexts, emit that here too ...
		// We will not be able to analyze hoisted-ness for dependent temporaries that we hallucinate here.
		auto mirrored_precision_itr = temporary_to_mirror_precision_alias.find(tmp.second);
		if (mirrored_precision_itr != temporary_to_mirror_precision_alias.end())
		{
			uint32_t mirror_id = mirrored_precision_itr->second;
			auto &mirror_flags = get_decoration_bitset(mirror_id);
			statement(flags_to_qualifiers_glsl(type, mirror_flags),
			          variable_decl(type, to_name(mirror_id)),
			          initializer, ";");
			// The temporary might be read from before it's assigned, set up the expression now.
			set<SPIRExpression>(mirror_id, to_name(mirror_id), tmp.first, true);
			hoisted_temporaries.insert(mirror_id);
		}
	}
}